

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

float vkt::tessellation::getClampedTessLevel(SpacingMode mode,float tessLevel)

{
  float fVar1;
  
  if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    fVar1 = 2.0;
  }
  else {
    if ((mode != SPACINGMODE_FRACTIONAL_ODD) && (mode != SPACINGMODE_EQUAL)) {
      return 0.0;
    }
    fVar1 = 1.0;
  }
  if (fVar1 <= tessLevel) {
    fVar1 = tessLevel;
  }
  return fVar1;
}

Assistant:

float getClampedTessLevel (const SpacingMode mode, const float tessLevel)
{
	switch (mode)
	{
		case SPACINGMODE_EQUAL:				return de::max(1.0f, tessLevel);
		case SPACINGMODE_FRACTIONAL_ODD:	return de::max(1.0f, tessLevel);
		case SPACINGMODE_FRACTIONAL_EVEN:	return de::max(2.0f, tessLevel);
		default:
			DE_ASSERT(false);
			return 0.0f;
	}
}